

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddRight
          (CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  byte bVar1;
  bool bVar2;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  CVariableData *local_30;
  CVariableData *variable;
  TVariableType local_20;
  TVariableIndex variableIndex;
  TVariableType variableType;
  TVariableTypeTag type_local;
  TVariableName name_local;
  CVariablesBuilder *this_local;
  
  variableIndex._2_1_ = type;
  variableIndex._3_1_ = name;
  _variableType = this;
  local_20 = checkTypeTag(this,type,(CQualifier **)0x0);
  if ((local_20 != VT_None) &&
     (bVar2 = checkName(this,variableIndex._3_1_), bVar1 = variableIndex._3_1_, bVar2)) {
    variable._4_4_ =
         *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)variableIndex._3_1_ * 4);
    if (variable._4_4_ == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,1,bVar1,&local_91);
      std::operator+((char *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "variable `");
      std::operator+(local_50,(char *)local_70);
      error(this,local_50);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      local_30 = this->variables + variable._4_4_;
      if (local_30->Type == local_20) {
        local_30->CountRight = local_30->CountRight + 1;
        return variable._4_4_;
      }
      errorTypesNotMatched(this,variableIndex._3_1_,local_30->Type);
    }
  }
  return -1;
}

Assistant:

TVariableIndex CVariablesBuilder::AddRight( const TVariableName name,
	const TVariableTypeTag type )
{
	const TVariableType variableType = checkTypeTag( type );
	if( variableType != VT_None && checkName( name ) ) {
		const TVariableIndex variableIndex = variableNameToIndex[name];
		if( variableIndex != InvalidVariableIndex ) {
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		} else {
			error( "variable `" + std::string( 1, static_cast<char>( name ) )
				+ "` wasn't defined in left part of rule" );
		}
	}
	return InvalidVariableIndex;
}